

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fire.hpp
# Opt level: O2

void __thiscall
fire::_matcher::_matcher
          (_matcher *this,int argc,char **argv,int main_argc,bool space_assignment,bool strict)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_1a4;
  allocator<char> local_1a3;
  allocator<char> local_1a2;
  allocator<char> local_1a1;
  _first<fire::identifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  undefined1 local_180 [32];
  arg_type local_160;
  string local_140 [32];
  identifier help;
  
  (this->_executable)._M_dataplus._M_p = (pointer)&(this->_executable).field_2;
  (this->_executable)._M_string_length = 0;
  (this->_executable).field_2._M_local_buf[0] = '\0';
  local_1a0 = &this->_deferred_error;
  (this->_positional).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_positional).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_positional).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_named).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_named).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_named).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_queried).super__Vector_base<fire::identifier,_std::allocator<fire::identifier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_queried).super__Vector_base<fire::identifier,_std::allocator<fire::identifier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_queried).super__Vector_base<fire::identifier,_std::allocator<fire::identifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _first<fire::identifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_first(local_1a0);
  *(undefined4 *)((long)&this->_main_argc + 3) = 0;
  this->_main_argc = 0;
  this->_main_argc = main_argc;
  this->_space_assignment = space_assignment;
  this->_strict = strict;
  parse(this,argc,argv);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_180,"-h",&local_1a1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"--help",&local_1a2);
  std::__cxx11::string::string<std::allocator<char>>(local_140,"Print the help message",&local_1a3);
  __l._M_len = 3;
  __l._M_array = (iterator)local_180;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_198,__l,&local_1a4);
  identifier::identifier(&help,&local_198,(optional<int>)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_180 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  get_and_mark_as_queried_abi_cxx11_
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::_matcher::arg_type>
              *)local_180,this,&help);
  this->_help_flag = local_160 != none_t;
  std::__cxx11::string::~string((string *)local_180);
  check(this,false);
  identifier::~identifier(&help);
  return;
}

Assistant:

_matcher::_matcher(int argc, const char **argv, int main_argc, bool space_assignment, bool strict) {
        _main_argc = main_argc;
        _space_assignment = space_assignment;
        _strict = strict;

        parse(argc, argv);
        identifier help({"-h", "--help", "Print the help message"}, optional<int>());
        _help_flag = get_and_mark_as_queried(help).second != arg_type::none_t;
        check(false);
    }